

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptStackWalker::Walk(JavascriptStackWalker *this,bool includeInlineFrames)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  size_t sVar4;
  ScriptEntryExitRecord *pSVar5;
  code *pcVar6;
  bool bVar7;
  ushort uVar8;
  undefined4 *puVar9;
  CallInfo CVar10;
  JavascriptFunction *pJVar11;
  undefined1 auVar12 [16];
  
  this->interpreterFrame = (InterpreterStackFrame *)0x0;
  uVar8 = *(ushort *)&this->field_0x50;
  if ((char)uVar8 < '\0' && (this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
    uVar8 = uVar8 & 0xff7f;
    *(ushort *)&this->field_0x50 = uVar8;
    (this->lastInternalFrameInfo).codeAddress = (void *)0x0;
    (this->lastInternalFrameInfo).framePointer = (void *)0x0;
    (this->lastInternalFrameInfo).stackCheckCodeHeight = 0xffffffff;
    (this->lastInternalFrameInfo).frameType = InternalFrameType_None;
    (this->lastInternalFrameInfo).function = (JavascriptFunction *)0x0;
    (this->lastInternalFrameInfo).hasInlinedFramesOnStack = false;
    (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout = false;
  }
  if ((uVar8 & 1) != 0) {
    if (!includeInlineFrames) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x2d4,"(includeInlineFrames)","includeInlineFrames");
      if (!bVar7) {
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    bVar7 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 = (ushort)*(undefined4 *)&this->field_0x50 & 0xfffe | (ushort)bVar7
    ;
    if (!bVar7) {
      (this->inlinedFrameWalker).parentFunction = (ScriptFunction *)0x0;
      Memory::DeleteArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*>
                (&Memory::HeapAllocator::Instance,(long)(this->inlinedFrameWalker).frameCount,
                 (this->inlinedFrameWalker).frames);
      (this->inlinedFrameWalker).frames = (InlinedFrame **)0x0;
      (this->inlinedFrameWalker).currentIndex = -1;
      (this->inlinedFrameWalker).frameCount = 0;
      CVar10 = GetCallInfo(this,false);
      if (CVar10._0_4_ < 0) {
        pJVar11 = GetCurrentFunction(this,false);
        uVar8 = *(ushort *)&this->field_0x50;
        if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
          sVar4 = (this->currentFrame).stackCheckCodeHeight;
          uVar1 = (this->currentFrame).frame;
          uVar2 = (this->currentFrame).codeAddr;
          auVar12._8_4_ = (int)uVar1;
          auVar12._0_8_ = uVar2;
          auVar12._12_4_ = (int)((ulong)uVar1 >> 0x20);
          (this->lastInternalFrameInfo).codeAddress = (void *)uVar2;
          (this->lastInternalFrameInfo).framePointer = (void *)auVar12._8_8_;
          (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar4;
          (this->lastInternalFrameInfo).frameType = InternalFrameType_LoopBody;
          (this->lastInternalFrameInfo).function = pJVar11;
          (this->lastInternalFrameInfo).hasInlinedFramesOnStack = true;
          (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout =
               (bool)((byte)uVar8 >> 6 & 1);
        }
        *(ushort *)&this->field_0x50 = uVar8 & 0xfffb;
        return 1;
      }
      return 1;
    }
    return 1;
  }
  *(ushort *)&this->field_0x50 = uVar8 & 0xfffd;
  if ((uVar8 & 0x10) == 0) {
    bVar7 = Amd64StackFrame::Next(&this->currentFrame);
    if (!bVar7) {
      this->field_0x50 = this->field_0x50 & 0xfb;
      return 0;
    }
  }
  else {
    *(ushort *)&this->field_0x50 = uVar8 & 0xffed;
  }
  pSVar5 = this->entryExitRecord;
  if ((this->currentFrame).addressOfCodeAddr != pSVar5->addrOfReturnAddrOfScriptEntryFunction) {
LAB_00aec339:
    UpdateFrame(this,includeInlineFrames);
    return 1;
  }
  bVar3 = *(byte *)pSVar5;
  pSVar5 = pSVar5->next;
  this->entryExitRecord = pSVar5;
  if (pSVar5 == (ScriptEntryExitRecord *)0x0) {
    uVar8 = 0xfffb;
  }
  else {
    if ((((bVar3 | (byte)(*(ushort *)&this->field_0x50 >> 8)) & 1) != 0) ||
       (this->scriptContext->isDiagnosticsScriptContext != false)) {
      this->scriptContext = pSVar5->scriptContext;
      Amd64StackFrame::SkipToFrame(&this->currentFrame,pSVar5->frameIdOfScriptExitFunction);
      goto LAB_00aec339;
    }
    uVar8 = 0xfefb;
  }
  *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & uVar8;
  return 0;
}

Assistant:

BOOL JavascriptStackWalker::Walk(bool includeInlineFrames)
    {
        // Walk one frame up the call stack.
        this->interpreterFrame = NULL;

#if ENABLE_NATIVE_CODEGEN
        if (lastInternalFrameInfo.codeAddress != nullptr && this->previousInterpreterFrameIsForLoopBody)
        {
            this->previousInterpreterFrameIsForLoopBody = false;
            ClearCachedInternalFrameInfo();
        }

        if (inlinedFramesBeingWalked)
        {
            Assert(includeInlineFrames);
            inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
            if (!inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.Close();
                if ((this->IsCurrentPhysicalFrameForLoopBody()))
                {
                    // Done walking inlined frames in a loop body, cache the native code address now
                    // in order to skip the loop body frame.
                    this->SetCachedInternalFrameInfo(InternalFrameType_LoopBody, this->GetCurrentFunctionFromPhysicalFrame(), true /*hasInlinedFramesOnStack*/, previousInterpreterFrameIsFromBailout);
                    isJavascriptFrame = false;
                }
            }

            return true;
        }
#endif
        this->hasInlinedFramesOnStack = false;
        if (this->isInitialFrame)
        {
            this->isInitialFrame = false; // Only walk initial frame once
        }
        else if (!this->currentFrame.Next())
        {
            this->isJavascriptFrame = false;
            return false;
        }

        // If we're at the entry from a host frame, hop to the frame from which we left the script.
        if (AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfInstructionPointer(), this->entryExitRecord->addrOfReturnAddrOfScriptEntryFunction))
        {
            BOOL hasCaller = this->entryExitRecord->hasCaller || this->forceFullWalk;

#ifdef CHECK_STACKWALK_EXCEPTION
            BOOL ignoreStackWalkException = this->entryExitRecord->ignoreStackWalkException;
#endif

            this->entryExitRecord = this->entryExitRecord->next;
            if (this->entryExitRecord == NULL)
            {
                this->isJavascriptFrame = false;
                return false;
            }

            if (!hasCaller && !this->scriptContext->IsDiagnosticsScriptContext())
            {
#ifdef CHECK_STACKWALK_EXCEPTION
                if (!ignoreStackWalkException)
                {
                    AssertMsg(false, "walk pass no caller frame");
                }
#endif
                this->isJavascriptFrame = false;
                return false;
            }

            this->scriptContext = this->entryExitRecord->scriptContext;
            this->currentFrame.SkipToFrame(this->entryExitRecord->frameIdOfScriptExitFunction);
        }

        this->UpdateFrame(includeInlineFrames);
        return true;
    }